

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O1

bool __thiscall ON_NurbsCage::IsValid(ON_NurbsCage *this,ON_TextLog *param_1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (((((((this->m_cv != (double *)0x0) && (this->m_knot[0] != (double *)0x0)) &&
         (this->m_knot[1] != (double *)0x0)) &&
        ((this->m_knot[2] != (double *)0x0 && (1 < this->m_order[0])))) &&
       ((1 < this->m_order[1] &&
        ((1 < this->m_order[2] && (this->m_order[0] <= this->m_cv_count[0])))))) &&
      (this->m_order[1] <= this->m_cv_count[1])) &&
     ((this->m_order[2] <= this->m_cv_count[2] && (0 < this->m_dim)))) {
    iVar5 = this->m_dim + (uint)this->m_is_rat;
    if ((this->m_cv_capacity < 1) ||
       (this->m_cv_count[2] * iVar5 * this->m_cv_count[1] * this->m_cv_count[0] <=
        this->m_cv_capacity)) {
      iVar1 = this->m_cv_stride[0];
      iVar2 = this->m_cv_stride[1];
      uVar4 = (uint)(iVar1 <= iVar2);
      uVar8 = (ulong)uVar4;
      uVar7 = (ulong)(iVar2 < iVar1);
      iVar3 = this->m_cv_stride[2];
      uVar6 = 2;
      if (this->m_cv_stride[uVar7] <= iVar3) {
        uVar6 = (ulong)(iVar2 < iVar1);
        uVar8 = 2;
        if (iVar3 < this->m_cv_stride[uVar4]) {
          uVar8 = (ulong)uVar4;
        }
        uVar7 = (ulong)uVar4;
        if (iVar3 < this->m_cv_stride[uVar4]) {
          uVar7 = 2;
        }
      }
      if ((iVar5 <= this->m_cv_stride[uVar6]) &&
         (this->m_cv_stride[uVar6] * this->m_cv_count[uVar6] <= this->m_cv_stride[uVar7])) {
        return this->m_cv_stride[uVar7] * this->m_cv_count[uVar7] <= this->m_cv_stride[uVar8];
      }
    }
  }
  return false;
}

Assistant:

bool ON_NurbsCage::IsValid( 
  ON_TextLog* //text_log 
) const
{
  if ( 0 == m_cv )
    return false;

  if ( 0 == m_knot[0] )
    return false;

  if ( 0 == m_knot[1] )
    return false;

  if ( 0 == m_knot[2] )
    return false;

  if ( m_order[0] < 2 )
    return false;
  if ( m_order[1] < 2 )
    return false;
  if ( m_order[2] < 2 )
    return false;

  if ( m_cv_count[0] < m_order[0] )
    return false;
  if ( m_cv_count[1] < m_order[1] )
    return false;
  if ( m_cv_count[2] < m_order[2] )
    return false;

  if ( m_dim <= 0 )
    return false;
  if ( m_is_rat != 0 && m_is_rat != 1 )
    return false;

  const int cvdim = m_is_rat ? (m_dim+1) : m_dim;

  if ( m_cv_capacity > 0 && m_cv_capacity < cvdim*m_cv_count[0]*m_cv_count[1]*m_cv_count[2] )
    return false;

  int i[3];
  i[0] = (m_cv_stride[0] <= m_cv_stride[1]) ? 0 : 1;
  i[1] = 1-i[0];
  if ( m_cv_stride[2] < m_cv_stride[i[0]] )
  {
    i[2] = i[1];
    i[1] = i[0];
    i[0] = 2;
  }
  else if ( m_cv_stride[2] < m_cv_stride[i[1]] )
  {
    i[2] = i[1];
    i[1] = 2;
  }
  else
  {
    i[2] = 2;
  }

  if ( m_cv_stride[i[0]] < cvdim )
    return false;
  if ( m_cv_stride[i[1]] < m_cv_stride[i[0]]*m_cv_count[i[0]] )
    return false;
  if ( m_cv_stride[i[2]] < m_cv_stride[i[1]]*m_cv_count[i[1]] )
    return false;

  return true;
}